

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineoption.cpp
# Opt level: O1

QStringList *
QCommandLineOptionPrivate::removeInvalidNames
          (QStringList *__return_storage_ptr__,QStringList nameList)

{
  ulong uVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  QString *pQVar6;
  result_type_conflict rVar7;
  long lVar8;
  iterator aend;
  iterator iVar9;
  QList<QString> *in_RSI;
  QList<QString> *name;
  IsInvalidName *pIVar10;
  const_iterator abegin;
  IsInvalidName *pIVar11;
  IsInvalidName *pIVar12;
  IsInvalidName *pIVar13;
  
  uVar1 = (in_RSI->d).size;
  if (uVar1 == 0) {
    removeInvalidNames();
    goto LAB_003df045;
  }
  pIVar13 = (IsInvalidName *)(in_RSI->d).ptr;
  name = in_RSI;
  pIVar10 = pIVar13;
  if (3 < uVar1) {
    lVar8 = (uVar1 >> 2) + 1;
    do {
      rVar7 = anon_unknown.dwarf_125bff1::IsInvalidName::operator()(pIVar10,(QString *)name);
      pIVar12 = pIVar10;
      if (rVar7) goto LAB_003defb8;
      rVar7 = anon_unknown.dwarf_125bff1::IsInvalidName::operator()(pIVar10 + 0x18,(QString *)name);
      pIVar12 = pIVar10 + 0x18;
      if (rVar7) goto LAB_003defb8;
      rVar7 = anon_unknown.dwarf_125bff1::IsInvalidName::operator()(pIVar10 + 0x30,(QString *)name);
      pIVar12 = pIVar10 + 0x30;
      if (rVar7) goto LAB_003defb8;
      rVar7 = anon_unknown.dwarf_125bff1::IsInvalidName::operator()(pIVar10 + 0x48,(QString *)name);
      pIVar12 = pIVar10 + 0x48;
      if (rVar7) goto LAB_003defb8;
      pIVar10 = pIVar10 + 0x60;
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  pIVar11 = pIVar13 + uVar1 * 0x18;
  lVar8 = ((long)pIVar11 - (long)pIVar10 >> 3) * -0x5555555555555555;
  if (lVar8 == 1) {
LAB_003def9b:
    rVar7 = anon_unknown.dwarf_125bff1::IsInvalidName::operator()(pIVar10,(QString *)name);
    pIVar12 = pIVar11;
    if (rVar7) {
      pIVar12 = pIVar10;
    }
  }
  else if (lVar8 == 2) {
LAB_003def28:
    rVar7 = anon_unknown.dwarf_125bff1::IsInvalidName::operator()(pIVar10,(QString *)name);
    pIVar12 = pIVar10;
    if (!rVar7) {
      pIVar10 = pIVar10 + 0x18;
      goto LAB_003def9b;
    }
  }
  else {
    pIVar12 = pIVar11;
    if ((lVar8 == 3) &&
       (rVar7 = anon_unknown.dwarf_125bff1::IsInvalidName::operator()(pIVar10,(QString *)name),
       pIVar12 = pIVar10, !rVar7)) {
      pIVar10 = pIVar10 + 0x18;
      goto LAB_003def28;
    }
  }
LAB_003defb8:
  lVar8 = (long)pIVar12 - (long)pIVar13;
  if ((lVar8 >> 3) * -0x5555555555555555 - (in_RSI->d).size != 0) {
    aend = QList<QString>::end(in_RSI);
    iVar9 = QList<QString>::begin(in_RSI);
    abegin.i = (QString *)((long)iVar9.i + lVar8);
    pIVar13 = (IsInvalidName *)(lVar8 + (long)iVar9.i);
    while (pIVar10 = pIVar13, pIVar13 = pIVar10 + 0x18, pIVar13 != (IsInvalidName *)aend.i) {
      rVar7 = anon_unknown.dwarf_125bff1::IsInvalidName::operator()(pIVar13,(QString *)name);
      if (!rVar7) {
        pDVar2 = ((abegin.i)->d).d;
        ((abegin.i)->d).d = *(Data **)pIVar13;
        *(Data **)pIVar13 = pDVar2;
        pcVar3 = ((abegin.i)->d).ptr;
        ((abegin.i)->d).ptr = *(char16_t **)(pIVar10 + 0x20);
        *(char16_t **)(pIVar10 + 0x20) = pcVar3;
        qVar4 = ((abegin.i)->d).size;
        ((abegin.i)->d).size = *(qsizetype *)(pIVar10 + 0x28);
        *(qsizetype *)(pIVar10 + 0x28) = qVar4;
        abegin.i = abegin.i + 1;
      }
    }
    QList<QString>::erase(in_RSI,abegin,(const_iterator)aend.i);
  }
LAB_003df045:
  pDVar5 = (in_RSI->d).d;
  pQVar6 = (in_RSI->d).ptr;
  (in_RSI->d).d = (Data *)0x0;
  (in_RSI->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).d = pDVar5;
  (__return_storage_ptr__->d).ptr = pQVar6;
  qVar4 = (in_RSI->d).size;
  (in_RSI->d).size = 0;
  (__return_storage_ptr__->d).size = qVar4;
  return __return_storage_ptr__;
}

Assistant:

QStringList QCommandLineOptionPrivate::removeInvalidNames(QStringList nameList)
{
    if (Q_UNLIKELY(nameList.isEmpty()))
        qWarning("QCommandLineOption: Options must have at least one name");
    else
        nameList.removeIf(IsInvalidName());
    return nameList;
}